

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser2.cc
# Opt level: O0

void __thiscall
iqxmlrpc::Parser::Impl::ParseStep::ParseStep(ParseStep *this,int type,xmlTextReaderPtr reader)

{
  int iVar1;
  bool local_21;
  xmlTextReaderPtr reader_local;
  int type_local;
  ParseStep *this_local;
  
  this->done = false;
  this->element_begin = type == 1;
  this->element_end = type == 0xf;
  local_21 = false;
  if ((this->element_begin & 1U) != 0) {
    iVar1 = xmlTextReaderIsEmptyElement(reader);
    local_21 = iVar1 != 0;
  }
  this->is_empty = local_21;
  this->is_text = type == 3;
  return;
}

Assistant:

ParseStep(int type, xmlTextReaderPtr reader):
      done(false),
      element_begin(type == XML_READER_TYPE_ELEMENT),
      element_end(type == XML_READER_TYPE_END_ELEMENT),
      is_empty(element_begin && xmlTextReaderIsEmptyElement(reader)),
      is_text(type == XML_READER_TYPE_TEXT)
    {
    }